

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  uint uVar2;
  BufferMode bufferMode;
  Context *pCVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int extraout_EAX;
  TestNode *pTVar7;
  TestNode *pTVar8;
  char *pcVar9;
  long *plVar10;
  undefined8 extraout_RAX;
  UniformBlockCase *pUVar11;
  undefined8 uVar12;
  long *plVar13;
  size_type *psVar14;
  long lVar15;
  bool bVar16;
  anon_struct_16_2_3f8b7511 *paVar17;
  undefined8 in_R9;
  long lVar18;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  TestNode *local_108;
  string baseName;
  allocator<char> local_c9;
  TestNode *local_c8;
  anon_struct_16_2_3f8b7511 *local_c0;
  anon_struct_16_2_f7718127 *local_b8;
  uint local_ac;
  long *local_a8 [2];
  long local_98 [2];
  VarType parentType;
  VarType childType;
  VarType parentType_1;
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "2_level_array","2-level basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  paVar17 = (anon_struct_16_2_3f8b7511 *)0x0;
  local_c8 = pTVar7;
  do {
    pTVar7 = local_c8;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_c0 = paVar17;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(long)paVar17].name,SSBOArrayLengthTests::init::arraysSized + 1);
    local_b8 = init::layoutFlags + (long)paVar17;
    local_108 = pTVar8;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    lVar15 = 0;
    do {
      DVar1 = init::basicTypes[lVar15];
      pcVar9 = glu::getDataTypeName(DVar1);
      gls::ub::VarType::VarType((VarType *)&baseName,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      gls::ub::VarType::VarType(&childType,(VarType *)&baseName,4);
      gls::ub::VarType::~VarType((VarType *)&baseName);
      gls::ub::VarType::VarType(&parentType,&childType,3);
      uVar2 = local_b8->flags;
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)local_108,(this->super_TestCaseGroup).m_context,pcVar9,&parentType
                 ,uVar2,(int)in_R9);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar18 = 0;
        bVar6 = true;
        do {
          bVar16 = bVar6;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a8,init::matrixFlags[lVar18].name,
                     (allocator<char> *)&parentType_1);
          plVar10 = (long *)std::__cxx11::string::append((char *)local_a8);
          local_128 = &local_118;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_118 = *plVar13;
            lStack_110 = plVar10[3];
          }
          else {
            local_118 = *plVar13;
            local_128 = (long *)*plVar10;
          }
          local_120 = plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar14) {
            baseName.field_2._M_allocated_capacity = *psVar14;
            baseName.field_2._8_8_ = plVar10[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar14;
            baseName._M_dataplus._M_p = (pointer)*plVar10;
          }
          baseName._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)local_108,pCVar3,baseName._M_dataplus._M_p,&parentType,
                     init::matrixFlags[lVar18].flags | uVar2,(int)in_R9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0],local_98[0] + 1);
          }
          lVar18 = 1;
          bVar6 = false;
        } while (bVar16);
      }
      gls::ub::VarType::~VarType(&parentType);
      gls::ub::VarType::~VarType(&childType);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x19);
    paVar17 = (anon_struct_16_2_3f8b7511 *)((long)&local_c0->name + 1);
  } while (paVar17 != (anon_struct_16_2_3f8b7511 *)0x3);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "3_level_array","3-level basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  paVar17 = (anon_struct_16_2_3f8b7511 *)0x0;
  local_c8 = pTVar7;
  do {
    pTVar7 = local_c8;
    pTVar8 = (TestNode *)operator_new(0x70);
    local_c0 = paVar17;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(long)paVar17].name,SSBOArrayLengthTests::init::arraysSized + 1);
    local_b8 = init::layoutFlags + (long)paVar17;
    local_108 = pTVar8;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    lVar15 = 0;
    do {
      DVar1 = init::basicTypes[lVar15];
      pcVar9 = glu::getDataTypeName(DVar1);
      gls::ub::VarType::VarType((VarType *)&baseName,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      gls::ub::VarType::VarType(&childType,(VarType *)&baseName,2);
      gls::ub::VarType::~VarType((VarType *)&baseName);
      gls::ub::VarType::VarType(&parentType,&childType,4);
      gls::ub::VarType::VarType(&parentType_1,&parentType,3);
      uVar2 = local_b8->flags;
      anon_unknown_1::createBlockBasicTypeCases
                ((TestCaseGroup *)local_108,(this->super_TestCaseGroup).m_context,pcVar9,
                 &parentType_1,uVar2,(int)in_R9);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar18 = 0;
        bVar6 = true;
        do {
          bVar16 = bVar6;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a8,init::matrixFlags[lVar18].name,&local_c9);
          plVar10 = (long *)std::__cxx11::string::append((char *)local_a8);
          local_128 = &local_118;
          plVar13 = plVar10 + 2;
          if ((long *)*plVar10 == plVar13) {
            local_118 = *plVar13;
            lStack_110 = plVar10[3];
          }
          else {
            local_118 = *plVar13;
            local_128 = (long *)*plVar10;
          }
          local_120 = plVar10[1];
          *plVar10 = (long)plVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar14) {
            baseName.field_2._M_allocated_capacity = *psVar14;
            baseName.field_2._8_8_ = plVar10[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar14;
            baseName._M_dataplus._M_p = (pointer)*plVar10;
          }
          baseName._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          anon_unknown_1::createBlockBasicTypeCases
                    ((TestCaseGroup *)local_108,pCVar3,baseName._M_dataplus._M_p,&parentType_1,
                     init::matrixFlags[lVar18].flags | uVar2,(int)in_R9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0],local_98[0] + 1);
          }
          lVar18 = 1;
          bVar6 = false;
        } while (bVar16);
      }
      gls::ub::VarType::~VarType(&parentType_1);
      gls::ub::VarType::~VarType(&parentType);
      gls::ub::VarType::~VarType(&childType);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x19);
    paVar17 = (anon_struct_16_2_3f8b7511 *)((long)&local_c0->name + 1);
  } while (paVar17 != (anon_struct_16_2_3f8b7511 *)0x3);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "2_level_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  uVar12 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  lVar15 = 0;
  do {
    local_ac = (uint)uVar12;
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[lVar15].name,SSBOArrayLengthTests::init::arraysSized + 1);
    tcu::TestNode::addChild(pTVar7,pTVar8);
    lVar18 = 0;
    local_c0 = init::bufferModes + lVar15;
    do {
      local_c8 = (TestNode *)(init::layoutFlags + lVar18);
      local_b8 = (anon_struct_16_2_f7718127 *)init::layoutFlags[lVar18].name;
      bVar6 = false;
      bVar16 = true;
      do {
        bVar5 = bVar16;
        paVar17 = local_c0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,(char *)local_b8,(allocator<char> *)&local_128);
        bufferMode = paVar17->mode;
        if (bVar6 || bufferMode != BUFFERMODE_SINGLE) {
          local_108 = (TestNode *)CONCAT44(local_108._4_4_,*(deUint32 *)&local_c8->m_testCtx);
          if (!bVar5) {
            std::__cxx11::string::append((char *)&baseName);
          }
          pUVar11 = (UniformBlockCase *)operator_new(0xb8);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,baseName._M_dataplus._M_p,
                     baseName._M_dataplus._M_p + baseName._M_string_length);
          std::__cxx11::string::append((char *)&local_128);
          gls::UniformBlockCase::UniformBlockCase
                    (pUVar11,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_128,
                     SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,bufferMode);
          iVar4 = (uint)(byte)~bVar5 * 3;
          (pUVar11->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00b369e8;
          *(uint *)&pUVar11[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_108 | 0x100;
          *(int *)((long)&pUVar11[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pUVar11);
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          pUVar11 = (UniformBlockCase *)operator_new(0xb8);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,baseName._M_dataplus._M_p,
                     baseName._M_dataplus._M_p + baseName._M_string_length);
          std::__cxx11::string::append((char *)&local_128);
          gls::UniformBlockCase::UniformBlockCase
                    (pUVar11,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_128,
                     SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,bufferMode);
          (pUVar11->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_00b369e8;
          *(uint *)&pUVar11[1].super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_108 | 0x200;
          *(int *)((long)&pUVar11[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pUVar11);
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (((ulong)local_108 & 0x10) == 0) {
            pUVar11 = (UniformBlockCase *)operator_new(0xb8);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            local_128 = &local_118;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&local_128);
            gls::UniformBlockCase::UniformBlockCase
                      (pUVar11,pCVar3->m_testCtx,pCVar3->m_renderCtx,(char *)local_128,
                       SSBOArrayLengthTests::init::arraysSized + 1,GLSL_VERSION_310_ES,bufferMode);
            (pUVar11->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__UniformBlockCase_00b369e8;
            *(uint *)&pUVar11[1].super_TestCase.super_TestNode._vptr_TestNode =
                 (uint)local_108 | 0x300;
            *(int *)((long)&pUVar11[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar4;
            tcu::TestNode::addChild(pTVar8,(TestNode *)pUVar11);
            if (local_128 != &local_118) {
              operator_delete(local_128,local_118 + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)baseName._M_dataplus._M_p != &baseName.field_2) {
          operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
        }
        bVar6 = true;
        bVar16 = false;
      } while (bVar5);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar15 = 1;
    uVar12 = 0;
  } while ((local_ac & 1) != 0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar7,(this->super_TestCaseGroup).m_context,"basic_type_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0xffc7,0x19,0x47e);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar7,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffffffff,0x32,0x2bc0);
  anon_unknown_1::createRandomCaseGroup
            ((TestCaseGroup *)pTVar7,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffffffff,0x32,0x2bf2);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.2_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_array", "2-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize	= 4;
				const int			parentSize	= 3;
				const VarType		childType	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize);
				const VarType		parentType	(childType, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.3_level_array
	{
		tcu::TestCaseGroup* nestedArrayGroup = new tcu::TestCaseGroup(m_testCtx, "3_level_array", "3-level basic array variable in single buffer");
		addChild(nestedArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			nestedArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				const glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*			typeName	= glu::getDataTypeName(type);
				const int			childSize0	= 2;
				const int			childSize1	= 4;
				const int			parentSize	= 3;
				const VarType		childType0	(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), childSize0);
				const VarType		childType1	(childType0, childSize1);
				const VarType		parentType	(childType1, parentSize);

				createBlockBasicTypeCases(layoutGroup, m_context, typeName, parentType, layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  parentType, layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.2_level_struct_array
	{
		tcu::TestCaseGroup* structArrayArrayGroup = new tcu::TestCaseGroup(m_testCtx, "2_level_struct_array", "Struct array in one uniform block");
		addChild(structArrayArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			structArrayArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new Block2LevelStructArrayCase(m_context, (baseName + "_both").c_str(),	"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	basicTypeArrays	= allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS|FEATURE_ARRAYS_OF_ARRAYS;
		const deUint32	allFeatures		= ~0u;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		createRandomCaseGroup(randomGroup, m_context, "basic_type_arrays",		"Arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	basicTypeArrays,	25, 1150);
		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,		50, 11200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,		50, 11250);
	}
}